

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O2

void __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
          *p)

{
  VariableRegion *pVVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  bool bVar3;
  Variable v;
  int v_00;
  int w;
  unsigned_long uVar4;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
  *__range5;
  undefined1 auStack_138 [16];
  anon_class_8_1_54a39801_for__func local_128;
  unsigned_long local_120;
  unsigned_long uStack_118;
  unsigned_long local_110;
  OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
  local_108;
  StlIter __begin0;
  StlIter __begin0_1;
  VariableRegion varStack;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> summand;
  VariableRegion local_74;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_50;
  
  local_50._iter._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)p->_ptr;
  local_50._iter._inner._to =
       ((long)(local_50._iter._func.a)->_cursor - (long)(local_50._iter._func.a)->_stack) / 0x30;
  local_50._iter._inner._next = 0;
  local_50._iter._inner._from = 0;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
  ::StlIter::StlIter(&__begin0,&local_50);
  while ((OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>)
         __begin0._cur.
         super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
         super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
         ._elem != (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                    )0x0) {
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (&summand,(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                        __begin0._cur.
                        super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>
                        .
                        super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                        ._elem);
    pMVar2 = summand.factors._ptr;
    uVar4 = ((long)((summand.factors._ptr)->_factors)._cursor -
            (long)((summand.factors._ptr)->_factors)._stack) / 0x1c;
    local_120 = 0;
    uStack_118 = 0;
    local_128.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                  summand.factors._ptr;
    local_108._elem = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    local_110 = uVar4;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:137:18),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
    ::collect<Lib::Stack>
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)&__begin0_1,
               (IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:137:18),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
                *)auStack_138);
    VariableRegion::VariableRegion
              (&varStack,(Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)&__begin0_1);
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)&__begin0_1);
    local_128.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)pMVar2;
    local_120 = 0;
    uStack_118 = 0;
    local_108._elem = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    local_110 = uVar4;
    bVar3 = Lib::
            FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>
            ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>
                       *)(auStack_138 + 8));
    if (bVar3) {
      v = Lib::
          MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>
          ::next((MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>
                  *)auStack_138);
      v_00 = root(this,v);
      pVVar1 = this->varRegions->_stack;
      Lib::CoproductImpl::TrivialOperations::MoveCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                     *)&local_74,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                     *)&varStack);
      VariableRegion::meet((VariableRegion *)&__begin0_1,pVVar1 + v_00,&local_74);
      Lib::CoproductImpl::TrivialOperations::MoveCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   *)(this->varRegions->_stack + v_00),
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   *)&__begin0_1);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                      *)&__begin0_1);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                      *)&local_74);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>)#1},false>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>)#3},Kernel::Variable>>
      ::StlIter::operator()
                ((StlIter *)&__begin0_1,
                 (IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
                  *)auStack_138);
      while (__begin0_1._cur.super_OptionBase<Kernel::Variable>._isSome != false) {
        w = root(this,(Variable)__begin0_1._cur.super_OptionBase<Kernel::Variable>._elem._elem);
        v_00 = joinRegions(this,v_00,w);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
        ::StlIter::operator++(&__begin0_1);
      }
    }
    Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                    *)&varStack);
    Kernel::RationalConstantType::~RationalConstantType(&summand.numeral);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
    ::StlIter::operator++(&__begin0);
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> p) 
  {
    for (auto summand : p->iterSummands()) {

      auto varIter = summand.factors->iter()
            .filter([](MonomFactor<NumTraits> factor) { return factor.term.template is<Variable>(); });

      auto varIter2 = varIter;
      auto varStack = VariableRegion(
          varIter2
            .map([](MonomFactor<NumTraits> factor) { return AnyNumber<MonomFactor>(factor); })
            .template collect<Stack>());

      auto vars = varIter.map([](MonomFactor<NumTraits> factor) { return factor.term.template unwrap<Variable>(); });

      if (vars.hasNext())  {
        auto cur = root(vars.next());

        varSet(cur) = std::move(varSet(cur)).meet(std::move(varStack));

        for (auto var : vars) {
          cur = joinRegions(cur, root(var));
        }

      }
    }
  }